

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O2

void __thiscall QLayout::removeWidget(QLayout *this,QWidget *widget)

{
  long *plVar1;
  QWidget *pQVar2;
  int iVar3;
  long in_FS_OFFSET;
  char local_40 [24];
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (widget == (QWidget *)0x0) {
    local_40[0] = '\x02';
    local_40[1] = '\0';
    local_40[2] = '\0';
    local_40[3] = '\0';
    local_40[0x14] = '\0';
    local_40[0x15] = '\0';
    local_40[0x16] = '\0';
    local_40[0x17] = '\0';
    local_40[4] = '\0';
    local_40[5] = '\0';
    local_40[6] = '\0';
    local_40[7] = '\0';
    local_40[8] = '\0';
    local_40[9] = '\0';
    local_40[10] = '\0';
    local_40[0xb] = '\0';
    local_40[0xc] = '\0';
    local_40[0xd] = '\0';
    local_40[0xe] = '\0';
    local_40[0xf] = '\0';
    local_40[0x10] = '\0';
    local_40[0x11] = '\0';
    local_40[0x12] = '\0';
    local_40[0x13] = '\0';
    local_28 = "default";
    QMessageLogger::warning(local_40,"QLayout::removeWidget: Cannot remove a null widget.");
  }
  else {
    iVar3 = 0;
    while( true ) {
      plVar1 = (long *)(**(code **)(*(long *)this + 0xa8))(this,iVar3);
      if (plVar1 == (long *)0x0) break;
      pQVar2 = (QWidget *)(**(code **)(*plVar1 + 0x68))(plVar1);
      if (pQVar2 == widget) {
        plVar1 = (long *)(**(code **)(*(long *)this + 0xb0))(this,iVar3);
        if (plVar1 != (long *)0x0) {
          (**(code **)(*plVar1 + 8))(plVar1);
        }
        (**(code **)(*(long *)this + 0x70))(this);
      }
      else {
        iVar3 = iVar3 + 1;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLayout::removeWidget(QWidget *widget)
{
    if (Q_UNLIKELY(!widget)) {
        qWarning("QLayout::removeWidget: Cannot remove a null widget.");
        return;
    }

    int i = 0;
    QLayoutItem *child;
    while ((child = itemAt(i))) {
        if (child->widget() == widget) {
            delete takeAt(i);
            invalidate();
        } else {
            ++i;
        }
    }
}